

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O0

void __thiscall
MT32Emu::Display::displayControlMessageReceived(Display *this,Bit8u *messageBytes,Bit32u length)

{
  bool bVar1;
  Bit8u local_1d;
  Bit32u local_1c;
  Bit8u emptyMessage [1];
  Bit8u *pBStack_18;
  Bit32u length_local;
  Bit8u *messageBytes_local;
  Display *this_local;
  
  local_1c = length;
  pBStack_18 = messageBytes;
  memset(&local_1d,0,1);
  bVar1 = Synth::isDisplayOldMT32Compatible(this->synth);
  if (bVar1) {
    if (local_1c == 1) {
      customDisplayMessageReceived(this,this->customMessageBuffer,0,0x14);
    }
    else {
      customDisplayMessageReceived(this,&local_1d,0,0);
    }
  }
  else if (local_1c == 2) {
    customDisplayMessageReceived(this,&local_1d,(uint)pBStack_18[1] << 7,0);
  }
  else if (local_1c == 1) {
    this->customMessageBuffer[0] = '\0';
    customDisplayMessageReceived(this,&local_1d,0x80,0);
  }
  return;
}

Assistant:

void Display::displayControlMessageReceived(const Bit8u *messageBytes, Bit32u length) {
	Bit8u emptyMessage[] = { 0 };
	if (synth.isDisplayOldMT32Compatible()) {
		if (length == 1) {
			customDisplayMessageReceived(customMessageBuffer, 0, LCD_TEXT_SIZE);
		} else {
			customDisplayMessageReceived(emptyMessage, 0, 0);
		}
	} else {
		// Always assume the third byte to be zero for simplicity.
		if (length == 2) {
			customDisplayMessageReceived(emptyMessage, messageBytes[1] << 7, 0);
		} else if (length == 1) {
			customMessageBuffer[0] = 0;
			customDisplayMessageReceived(emptyMessage, 0x80, 0);
		}
	}
}